

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_param.cc
# Opt level: O3

void __thiscall ParamField::GenInitCode(ParamField *this,Output *out_cc,Env *env)

{
  char *pcVar1;
  
  pcVar1 = Env::LValue(env,(this->super_Field).id_);
  Output::println(out_cc,"%s = %s;",pcVar1,(((this->super_Field).id_)->name)._M_dataplus._M_p);
  Env::SetEvaluated(env,(this->super_Field).id_,true);
  return;
}

Assistant:

void ParamField::GenInitCode(Output* out_cc, Env* env)
	{
	out_cc->println("%s = %s;", env->LValue(id()), id()->Name());
	env->SetEvaluated(id());
	}